

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O3

Own<capnp::ClientHook> __thiscall
capnp::anon_unknown_0::membrane
          (anon_unknown_0 *this,Own<capnp::ClientHook> *inner,MembranePolicy *policy,bool reverse)

{
  ClientHook *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  long *plVar4;
  Disposer *pDVar5;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *pCVar6;
  ClientHook *extraout_RDX_01;
  ClientHook *extraout_RDX_02;
  ClientHook *pCVar7;
  ClientHook **ppCVar8;
  ClientHook *pCVar9;
  Own<capnp::ClientHook> OVar10;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined8 uStack_90;
  ClientHook *local_80 [9];
  ClientHook *local_38;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  pCVar1 = (ClientHook *)inner->disposer;
  pCVar9 = inner->ptr;
  inner->ptr = (ClientHook *)0x0;
  iVar2 = (*pCVar9->_vptr_ClientHook[5])(pCVar9);
  if ((undefined1 *)CONCAT44(extraout_var,iVar2) == &(anonymous_namespace)::DUMMY) {
    iVar2 = (*policy->_vptr_MembranePolicy[6])(policy);
    plVar3 = (long *)CONCAT44(extraout_var_00,iVar2);
    plVar4 = (long *)(**(code **)(*pCVar9[6]._vptr_ClientHook + 0x30))();
    if ((plVar4 != plVar3) || ((bool)*(char *)&pCVar9[7]._vptr_ClientHook != !reverse))
    goto LAB_003a6ab3;
    (**(code **)(*pCVar9[4]._vptr_ClientHook + 0x20))(local_80 + 8);
    if (reverse) {
      ppCVar8 = local_80 + 6;
      local_80[6] = local_80[8];
      local_80[7] = local_38;
      (**(code **)(*plVar3 + 0x38))(&local_98,plVar3,ppCVar8,pCVar9[6]._vptr_ClientHook,policy);
      *(undefined4 *)this = local_98;
      *(undefined4 *)(this + 4) = uStack_94;
      *(undefined4 *)(this + 8) = (undefined4)uStack_90;
      *(undefined4 *)(this + 0xc) = uStack_90._4_4_;
      pCVar7 = local_80[7];
    }
    else {
      ppCVar8 = local_80 + 4;
      local_80[4] = local_80[8];
      local_80[5] = local_38;
      (**(code **)(*plVar3 + 0x40))(&local_98,plVar3,ppCVar8,pCVar9[6]._vptr_ClientHook,policy);
      *(undefined4 *)this = local_98;
      *(undefined4 *)(this + 4) = uStack_94;
      *(undefined4 *)(this + 8) = (undefined4)uStack_90;
      *(undefined4 *)(this + 0xc) = uStack_90._4_4_;
      pCVar7 = local_80[5];
    }
    uStack_90 = 0;
    if (pCVar7 != (ClientHook *)0x0) goto LAB_003a6b38;
  }
  else {
LAB_003a6ab3:
    if (reverse) {
      ppCVar8 = local_80 + 2;
      local_80[2] = pCVar1;
      local_80[3] = pCVar9;
      iVar2 = (*policy->_vptr_MembranePolicy[4])(&local_a8,policy,ppCVar8);
      pDVar5 = (Disposer *)CONCAT44(extraout_var_01,iVar2);
      *(undefined4 *)this = local_a8;
      *(undefined4 *)(this + 4) = uStack_a4;
      *(undefined4 *)(this + 8) = (undefined4)uStack_a0;
      *(undefined4 *)(this + 0xc) = uStack_a0._4_4_;
      pCVar6 = extraout_RDX;
      pCVar7 = local_80[3];
    }
    else {
      ppCVar8 = local_80;
      local_80[0] = pCVar1;
      local_80[1] = pCVar9;
      iVar2 = (*policy->_vptr_MembranePolicy[5])(&local_a8,policy,ppCVar8);
      pDVar5 = (Disposer *)CONCAT44(extraout_var_02,iVar2);
      *(undefined4 *)this = local_a8;
      *(undefined4 *)(this + 4) = uStack_a4;
      *(undefined4 *)(this + 8) = (undefined4)uStack_a0;
      *(undefined4 *)(this + 0xc) = uStack_a0._4_4_;
      pCVar6 = extraout_RDX_00;
      pCVar7 = local_80[1];
    }
    uStack_a0 = 0;
    if (pCVar7 == (ClientHook *)0x0) goto LAB_003a6b67;
    pCVar9 = (ClientHook *)0x0;
LAB_003a6b38:
    ppCVar8[1] = (ClientHook *)0x0;
    iVar2 = (**(*ppCVar8)->_vptr_ClientHook)
                      (*ppCVar8,pCVar7->_vptr_ClientHook[-2] + (long)&pCVar7->_vptr_ClientHook);
    pDVar5 = (Disposer *)CONCAT44(extraout_var_03,iVar2);
    pCVar6 = extraout_RDX_01;
    if (pCVar9 == (ClientHook *)0x0) goto LAB_003a6b67;
  }
  iVar2 = (**pCVar1->_vptr_ClientHook)
                    (pCVar1,pCVar9->_vptr_ClientHook[-2] + (long)&pCVar9->_vptr_ClientHook);
  pDVar5 = (Disposer *)CONCAT44(extraout_var_04,iVar2);
  pCVar6 = extraout_RDX_02;
LAB_003a6b67:
  OVar10.ptr = pCVar6;
  OVar10.disposer = pDVar5;
  return OVar10;
}

Assistant:

kj::Own<ClientHook> membrane(kj::Own<ClientHook> inner, MembranePolicy& policy, bool reverse) {
  return MembraneHook::wrap(kj::mv(inner), policy, reverse);
}